

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

Aig_Obj_t * Aig_Compose(Aig_Man_t *p,Aig_Obj_t *pRoot,Aig_Obj_t *pFunc,int iVar)

{
  Aig_Obj_t *pAVar1;
  
  if (iVar < p->nObjs[2]) {
    if ((iVar < 0) || (p->vCis->nSize <= iVar)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pAVar1 = (Aig_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe);
    Aig_Compose_rec(p,pAVar1,pFunc,(Aig_Obj_t *)p->vCis->pArray[(uint)iVar]);
    Aig_ConeUnmark_rec(pAVar1);
    pAVar1 = (Aig_Obj_t *)((ulong)((uint)pRoot & 1) ^ (ulong)(pAVar1->field_5).pData);
  }
  else {
    pAVar1 = (Aig_Obj_t *)0x0;
    printf("Aig_Compose(): The PI variable %d is not defined.\n",(ulong)(uint)iVar);
  }
  return pAVar1;
}

Assistant:

Aig_Obj_t * Aig_Compose( Aig_Man_t * p, Aig_Obj_t * pRoot, Aig_Obj_t * pFunc, int iVar )
{
    // quit if the PI variable is not defined
    if ( iVar >= Aig_ManCiNum(p) )
    {
        printf( "Aig_Compose(): The PI variable %d is not defined.\n", iVar );
        return NULL;
    }
    // recursively perform composition
    Aig_Compose_rec( p, Aig_Regular(pRoot), pFunc, Aig_ManCi(p, iVar) );
    // clear the markings
    Aig_ConeUnmark_rec( Aig_Regular(pRoot) );
    return Aig_NotCond( (Aig_Obj_t *)Aig_Regular(pRoot)->pData, Aig_IsComplement(pRoot) );
}